

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTFactory.cpp
# Opt level: O1

RefAST __thiscall ASTFactory::create(ASTFactory *this)

{
  ASTNode *n;
  AST *this_00;
  _func_int **pp_Var1;
  long in_RSI;
  
  n = (ASTNode *)(**(code **)(in_RSI + 8))();
  (*n->_vptr_ASTNode[8])(n,0);
  this_00 = (AST *)operator_new(0x20);
  AST::AST(this_00,n);
  pp_Var1 = (_func_int **)operator_new(0x10);
  *pp_Var1 = (_func_int *)this_00;
  *(undefined4 *)(pp_Var1 + 1) = 1;
  this->_vptr_ASTFactory = pp_Var1;
  return (RefAST)(Ref *)this;
}

Assistant:

RefAST ASTFactory::create()
{
	ASTNode* node = nodeFactory(); //new CommonASTNode();
	node->setType(Token::INVALID_TYPE);
	return RefAST(new AST(node));
}